

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O1

CharTrie * __thiscall UnifiedRegex::CharTrie::Add(CharTrie *this,ArenaAllocator *allocator,Char c)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Char CVar3;
  int iVar4;
  undefined8 uVar5;
  bool bVar6;
  CharTrieEntry *pCVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  CharTrie *pCVar11;
  int iVar12;
  int in_R9D;
  long lVar13;
  ulong uVar14;
  int iVar15;
  
  iVar4 = this->count;
  if (iVar4 == 0) {
    in_R9D = 0;
    pCVar11 = (CharTrie *)0x0;
  }
  else {
    iVar10 = iVar4 + -1;
    iVar12 = 0;
    pCVar11 = this;
    do {
      iVar15 = (iVar10 + iVar12) / 2;
      CVar3 = this->children[iVar15].c;
      if (CVar3 == c) {
        pCVar11 = (CharTrie *)&DAT_00000001;
LAB_00e73906:
        bVar6 = false;
        in_R9D = iVar15;
      }
      else {
        if ((ushort)c <= (ushort)CVar3) {
          iVar10 = iVar15 + -1;
          if (iVar12 < iVar15) goto LAB_00e7392c;
          pCVar11 = (CharTrie *)0x0;
          goto LAB_00e73906;
        }
        iVar12 = iVar15 + 1;
        if (iVar10 <= iVar15) {
          pCVar11 = (CharTrie *)0x0;
          iVar15 = iVar12;
          goto LAB_00e73906;
        }
LAB_00e7392c:
        bVar6 = true;
      }
    } while (bVar6);
  }
  lVar13 = (long)in_R9D;
  if (((ulong)pCVar11 & 1) == 0) {
    iVar10 = this->capacity;
    if (iVar10 <= iVar4) {
      uVar14 = 4;
      if (4 < iVar10 * 2) {
        uVar14 = (ulong)(uint)(iVar10 * 2);
      }
      pCVar7 = (CharTrieEntry *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Realloc
                         (&allocator->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                          this->children,(long)iVar10 << 5,uVar14 << 5);
      this->children = pCVar7;
      this->capacity = (int)uVar14;
    }
    lVar8 = (long)this->count;
    if (in_R9D < this->count) {
      lVar9 = lVar8 << 5;
      do {
        pCVar7 = this->children;
        lVar8 = lVar8 + -1;
        *(undefined2 *)((long)&pCVar7->c + lVar9) = *(undefined2 *)((long)&pCVar7[-1].c + lVar9);
        puVar1 = (undefined8 *)((long)pCVar7 + lVar9 + -0x18);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pCVar7->node).children + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        *(undefined4 *)((long)&(pCVar7->node).count + lVar9) =
             *(undefined4 *)((long)pCVar7 + lVar9 + -8);
        lVar9 = lVar9 + -0x20;
      } while (lVar13 < lVar8);
    }
    pCVar7 = this->children;
    pCVar7[lVar13].c = c;
    pCVar7[lVar13].node.isAccepting = false;
    pCVar7[lVar13].node.capacity = 0;
    pCVar7[lVar13].node.count = 0;
    pCVar7[lVar13].node.children = (CharTrieEntry *)0x0;
    this->count = this->count + 1;
  }
  return &this->children[lVar13].node;
}

Assistant:

CharTrie* CharTrie::Add(ArenaAllocator* allocator, Char c)
    {
        int i;
        if (!Find(c, i))
        {
            if (capacity <= count)
            {
                int newCapacity = max(capacity * 2, initCapacity);
                children = (CharTrieEntry*)allocator->Realloc(children, capacity * sizeof(CharTrieEntry), newCapacity * sizeof(CharTrieEntry));
                capacity = newCapacity;
            }

            for (int j = count; j > i; j--)
            {
                children[j].c = children[j - 1].c;
                children[j].node = children[j - 1].node;
            }
            children[i].c = c;
            children[i].node.Reset();
            count++;
        }
        return &children[i].node;
    }